

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O0

void __thiscall Timidity::Renderer::recompute_amp(Renderer *this,Voice *v)

{
  uint uVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double cc11atten;
  double cc7atten;
  double velatten;
  int chanexpr;
  int chanvol;
  Channel *chan;
  Voice *v_local;
  Renderer *this_local;
  
  uVar1 = (uint)this->channel[v->channel].volume;
  uVar2 = (uint)this->channel[v->channel].expression;
  if (v->sample->type == '\0') {
    v->attenuation =
         (float)((uint)(byte)vol_table[(int)((uVar1 * uVar2) / 0x7f)] *
                (uint)(byte)vol_table[v->velocity]) * 1.53787e-05;
  }
  else {
    dVar3 = log10(127.0 / (double)v->velocity);
    dVar4 = log10(127.0 / (double)uVar1);
    dVar5 = log10(127.0 / (double)uVar2);
    v->attenuation = (float)((dVar3 + dVar4 + dVar5) * 400.0) + v->sample->initial_attenuation;
  }
  return;
}

Assistant:

void Renderer::recompute_amp(Voice *v)
{
	Channel *chan = &channel[v->channel];
	int chanvol = chan->volume;
	int chanexpr = chan->expression;

	if (v->sample->type == INST_GUS)
	{
		v->attenuation = (vol_table[(chanvol * chanexpr) / 127] * vol_table[v->velocity]) * ((127 + 64) / 12419775.f);
	}
	else
	{
		// Implicit modulators from SF2 spec
		double velatten, cc7atten, cc11atten;

		velatten = log10(127.0 / v->velocity);
		cc7atten = log10(127.0 / chanvol);
		cc11atten = log10(127.0 / chanexpr);
		v->attenuation = float(400 * (velatten + cc7atten + cc11atten)) + v->sample->initial_attenuation;
	}
}